

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NumberUtilities.cpp
# Opt level: O3

double Js::NumberUtilities::DblFromBinary<unsigned_char>
                 (uchar *psz,uchar **ppchLim,bool isNumericSeparatorEnabled)

{
  uint uVar1;
  byte *pbVar2;
  ulong uVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  double dVar8;
  uint uVar9;
  uint uVar10;
  byte *pbVar11;
  
  pbVar2 = psz;
  while( true ) {
    do {
      pbVar11 = pbVar2;
      bVar5 = *pbVar11;
      pbVar2 = pbVar11 + 1;
    } while (bVar5 == 0x30);
    if ((bVar5 & 0xfe) == 0x30) break;
    if ((((pbVar11 <= psz) || (bVar5 != 0x5f)) || (!isNumericSeparatorEnabled)) ||
       ((pbVar11[-1] != 0x30 || ((*pbVar2 & 0xfe) != 0x30)))) {
      *ppchLim = pbVar11;
      return 0.0;
    }
  }
  uVar9 = 1;
  uVar3 = 0;
  bVar5 = 0;
  do {
    bVar4 = pbVar11[1];
    pbVar2 = pbVar11;
    while( true ) {
      pbVar11 = pbVar2 + 1;
      uVar10 = bVar4 - 0x30;
      uVar1 = (uint)uVar3;
      uVar6 = (uint)(uVar3 >> 0x20);
      if (uVar10 < 2) break;
      if ((((bVar4 != 0x5f) || (!isNumericSeparatorEnabled)) || ((int)uVar9 < 1)) ||
         ((*pbVar2 == 0x5f || (bVar4 = pbVar2[2], pbVar2 = pbVar11, (bVar4 & 0xfe) != 0x30)))) {
        *ppchLim = pbVar11;
        if (0x7fe < (int)(uVar9 + 0x3fe)) {
          return INFINITY;
        }
        uVar6 = uVar6 | (uVar9 + 0x3fe) * 0x100000;
        dVar8 = (double)(uVar3 & 0xffffffff | (ulong)uVar6 << 0x20);
        if (-1 < (char)bVar5) {
          return dVar8;
        }
        if (((bVar5 & 0x7f) == 0) && ((uVar3 & 1) == 0)) {
          return dVar8;
        }
        if (uVar1 == 0xffffffff) {
          return (double)((ulong)(uVar6 + 1) << 0x20);
        }
        return (double)CONCAT44(uVar6,uVar1 + 1);
      }
    }
    if (uVar9 < 0x15) {
      uVar7 = (ulong)(uVar6 | uVar10 << (0x14U - (char)uVar9 & 0x1f)) << 0x20;
      uVar3 = uVar3 & 0xffffffff;
LAB_00681963:
      uVar3 = uVar3 | uVar7;
    }
    else {
      if (uVar9 < 0x35) {
        uVar7 = (ulong)(uVar1 | uVar10 << (0x34U - (char)uVar9 & 0x1f));
        uVar3 = uVar3 & 0xffffffff00000000;
        goto LAB_00681963;
      }
      if (uVar9 == 0x35) {
        bVar5 = bVar4 << 7;
      }
      else {
        bVar5 = bVar5 | (byte)uVar10;
      }
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

double NumberUtilities::DblFromBinary(const EncodedChar *psz, const EncodedChar **ppchLim, bool isNumericSeparatorEnabled)
    {
        double dbl = 0;
        Assert(Js::NumberUtilities::LuHiDbl(dbl) == 0);
        Assert(Js::NumberUtilities::LuLoDbl(dbl) == 0);
        uint uT;
        byte bExtra = 0;
        int cbit = 0;
        const EncodedChar* pszSave = psz;

        // Skip leading zeros.
LSkipZeroes:
        while (*psz == '0')
            psz++;

        // Get the first digit.
        uT = *psz - '0';
        if (uT > 1)
        {
            // We can skip over this numeric separator character if:
            //  - numeric separators are enabled
            //  - we've walked past at least one zero character (ie: this isn't the first character in psz)
            //  - the previous character was a zero
            //  - the following character is a valid binary digit
            if (*psz == '_' && isNumericSeparatorEnabled && pszSave < psz && psz[-1] == '0' && static_cast<uint>(psz[1] - '0') <= 1)
            {
                psz++;
                goto LSkipZeroes;
            }

            *ppchLim = psz;
            return dbl;
        }

        //Now that leading zeros are skipped first bit should be one so lets
        //go ahead and count it and increment psz
        cbit = 1;
        psz++;

        // According to the existing implementations these numbers
        // should n bits away from 21 and 53. The n bits are determined by the
        // numerical type. for example since 4 bits are necessary to represent a
        // hexadecimal number and 3 bits to represent an octal you will see that
        // the hex case is represented by 21-4 = 17 and the octal case is represented
        // by 21-3 = 18, thus for binary where 1 bit is need to represent 2 numbers 21-1 = 20
        const uint rightShiftValue = 20;
        // Why 52? 52 is the last explicit bit and 1 bit away from 53 (max bits of precision
        // for double precision floating point)
        const uint leftShiftValue = 52;

LGetBinaryDigit:
        uT = *psz - '0';
        if (uT <= 1)
        {
            if (cbit <= rightShiftValue)
            {
                Js::NumberUtilities::LuHiDbl(dbl) |= (uint32)uT << (rightShiftValue - cbit);
            }
            else if (cbit <= leftShiftValue)
            {
                Js::NumberUtilities::LuLoDbl(dbl) |= (uint32)uT << (leftShiftValue - cbit);
            }
            else if (cbit == leftShiftValue + 1)//53 bits
            {
                Js::NumberUtilities::LuLoDbl(dbl) |= (uint32)uT >> (cbit - leftShiftValue);
                bExtra = (byte)(uT << (60 - cbit));
            }
            else if (0 != uT)
            {
                bExtra |= 1;
            }
            cbit++;
            psz++;
            goto LGetBinaryDigit;
        }
        else if (*psz == '_')
        {
            if (isNumericSeparatorEnabled && cbit > 0 && psz[-1] != '_' && static_cast<uint>(psz[1] - '0') <= 1)
            {
                psz++;
                goto LGetBinaryDigit;
            }
        }
        // Set the lim.
        *ppchLim = psz;

        // Set the exponent.
        cbit += 1022;
        if (cbit > 2046)
        {
            // Overflow to Infinity
            Js::NumberUtilities::LuHiDbl(dbl) = 0x7FF00000;
            Js::NumberUtilities::LuLoDbl(dbl) = 0;
            return dbl;
        }

        Js::NumberUtilities::LuHiDbl(dbl) |= (uint32)cbit << 20;

        // Use bExtra to round.
        if ((bExtra & 0x80) && ((bExtra & 0x7F) || (Js::NumberUtilities::LuLoDbl(dbl) & 1)))
        {
            // Round up. Note that this overflows the mantissa correctly,
            // even to Infinity.
            if (0 == ++Js::NumberUtilities::LuLoDbl(dbl))
                ++Js::NumberUtilities::LuHiDbl(dbl);
        }
        return dbl;
    }